

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

int getboolattrib(rnndb *db,char *file,int line,xmlAttr *attr)

{
  char cVar1;
  int iVar2;
  char *__s1;
  
  __s1 = getattrib(db,file,line,attr);
  iVar2 = strcmp(__s1,"yes");
  if (iVar2 == 0) {
    return 1;
  }
  cVar1 = *__s1;
  if (cVar1 == '0') {
    cVar1 = __s1[1];
  }
  else {
    if (cVar1 != 'n') {
      if ((cVar1 == '1') && (__s1[1] == '\0')) {
        return 1;
      }
      goto LAB_0010437f;
    }
    if (__s1[1] != 'o') goto LAB_0010437f;
    cVar1 = __s1[2];
  }
  if (cVar1 == '\0') {
    return 0;
  }
LAB_0010437f:
  fprintf(_stderr,"%s:%d: invalid boolean value \"%s\" in attribute \"%s\"\n",file,(ulong)(uint)line
          ,__s1,attr->name);
  db->estatus = 1;
  return 0;
}

Assistant:

static int getboolattrib (struct rnndb *db, char *file, int line, xmlAttr *attr) {
	char *c = getattrib(db, file, line, attr);
	if (!strcmp(c, "yes") || !strcmp(c, "1"))
		return 1;
	if (!strcmp(c, "no") || !strcmp(c, "0"))
		return 0;
	fprintf (stderr, "%s:%d: invalid boolean value \"%s\" in attribute \"%s\"\n", file, line, c, attr->name);
	db->estatus = 1;
	return 0;
}